

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O3

uint32_t __thiscall
Function_Pool::FunctionTask::Sum
          (FunctionTask *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  size_t count;
  
  FunctionPoolTask::_setup(&this->super_FunctionPoolTask,image,x,y,width,height);
  count = AreaInfo::_size(&((this->super_FunctionPoolTask)._infoIn1._M_t.
                            super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
                            .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>.
                           _M_head_impl)->super_AreaInfo);
  OutputInfo::resize(&this->_dataOut,count);
  this->functionId = _Sum;
  FunctionPoolTask::_processTask(&this->super_FunctionPoolTask);
  uVar1 = OutputInfo::getSum(&this->_dataOut);
  return uVar1;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
        {
            _setup( image, x, y, width, height );
            _dataOut.resize( _infoIn1->_size() );
            _process( _Sum );
            return _dataOut.getSum();
        }